

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_convolver_impl.cpp
# Opt level: O0

void ear::dsp::block_convolver_impl::fade_down_and_up
               (Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *in,
               Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *down,
               Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *up)

{
  Index IVar1;
  Index IVar2;
  Scalar *pSVar3;
  float fVar4;
  CoeffReturnType CVar5;
  real_t b_v;
  real_t a_v;
  int i;
  real_t i_scale;
  Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *up_local;
  Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *down_local;
  Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *in_local;
  
  IVar1 = Eigen::
          EigenBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ::size((EigenBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  *)in);
  IVar2 = Eigen::
          EigenBase<Eigen::Ref<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
          size((EigenBase<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                *)down);
  _assert_impl(IVar1 <= IVar2,"down is incorrect size");
  IVar1 = Eigen::
          EigenBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ::size((EigenBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  *)in);
  IVar2 = Eigen::
          EigenBase<Eigen::Ref<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
          size((EigenBase<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                *)up);
  _assert_impl(IVar1 <= IVar2,"up is incorrect size");
  IVar1 = Eigen::
          EigenBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ::size((EigenBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  *)in);
  b_v = 0.0;
  while( true ) {
    IVar2 = Eigen::
            EigenBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ::size((EigenBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    *)in);
    if (IVar2 <= (int)b_v) break;
    fVar4 = (float)(int)b_v * (1.0 / (float)IVar1);
    CVar5 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::operator[]((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                          *)in,(long)(int)b_v);
    pSVar3 = Eigen::
             DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator[]((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)up,(long)(int)b_v);
    *pSVar3 = fVar4 * CVar5;
    CVar5 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::operator[]((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                          *)in,(long)(int)b_v);
    pSVar3 = Eigen::
             DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator[]((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)down,(long)(int)b_v);
    *pSVar3 = (1.0 - fVar4) * CVar5;
    b_v = (real_t)((int)b_v + 1);
  }
  return;
}

Assistant:

void fade_down_and_up(const Eigen::Ref<const TDVector> &in,
                            Eigen::Ref<TDVector> down,
                            Eigen::Ref<TDVector> up) {
        ear_assert(in.size() <= down.size(), "down is incorrect size");
        ear_assert(in.size() <= up.size(), "up is incorrect size");

        real_t i_scale = (real_t)1.0 / (real_t)in.size();

        for (int i = 0; i < in.size(); i++) {
          real_t a_v = (real_t)i * i_scale;
          real_t b_v = 1.0f - a_v;
          up[i] = a_v * in[i];
          down[i] = b_v * in[i];
        }
      }